

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SweepGradientShadingPatternWritingTask.cpp
# Opt level: O2

void __thiscall
SweepGradientShadingPatternWritingTask::SweepGradientShadingPatternWritingTask
          (SweepGradientShadingPatternWritingTask *this,double inCX,double inCY,
          double inStartAngleRad,double inEndAngleRad,InterpretedGradientStopList *inColorLine,
          FT_PaintExtend inGradientExtend,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  (this->super_IObjectEndWritingTask)._vptr_IObjectEndWritingTask =
       (_func_int **)&PTR__SweepGradientShadingPatternWritingTask_003709f0;
  this_00 = &this->mColorLine;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node._M_size = 0;
  PDFRectangle::PDFRectangle(&this->mBounds);
  PDFMatrix::PDFMatrix(&this->mMatrix);
  this->cX = inCX;
  this->cY = inCY;
  this->startAngleRad = inStartAngleRad;
  this->endAngleRad = inEndAngleRad;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::operator=
            (this_00,inColorLine);
  this->mGradientExtend = inGradientExtend;
  dVar1 = inBounds->LowerLeftX;
  dVar2 = inBounds->LowerLeftY;
  dVar3 = inBounds->UpperRightY;
  (this->mBounds).UpperRightX = inBounds->UpperRightX;
  (this->mBounds).UpperRightY = dVar3;
  (this->mBounds).LowerLeftX = dVar1;
  (this->mBounds).LowerLeftY = dVar2;
  dVar1 = inMatrix->a;
  dVar2 = inMatrix->b;
  dVar3 = inMatrix->c;
  dVar4 = inMatrix->d;
  dVar5 = inMatrix->f;
  (this->mMatrix).e = inMatrix->e;
  (this->mMatrix).f = dVar5;
  (this->mMatrix).c = dVar3;
  (this->mMatrix).d = dVar4;
  (this->mMatrix).a = dVar1;
  (this->mMatrix).b = dVar2;
  this->mPatternObjectId = inPatternObjectId;
  return;
}

Assistant:

SweepGradientShadingPatternWritingTask::SweepGradientShadingPatternWritingTask(
    double inCX,
    double inCY,
    double inStartAngleRad,
    double inEndAngleRad,
    InterpretedGradientStopList inColorLine,
    FT_PaintExtend inGradientExtend,
    PDFRectangle inBounds,
    PDFMatrix inMatrix,
    ObjectIDType inPatternObjectId
) {
    cX = inCX;
    cY = inCY;
    startAngleRad = inStartAngleRad;
    endAngleRad = inEndAngleRad;
    mColorLine = inColorLine;
    mGradientExtend = inGradientExtend;
    mBounds = inBounds;
    mMatrix = inMatrix;
    mPatternObjectId = inPatternObjectId;
}